

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

void helicsTranslatorSet(HelicsTranslator trans,char *prop,double val,HelicsError *err)

{
  Translator *pTVar1;
  TranslatorObject *pTVar2;
  size_t sVar3;
  
  pTVar2 = getTranslatorObj(trans,err);
  if ((pTVar2 != (TranslatorObject *)0x0) &&
     (pTVar1 = pTVar2->transPtr, pTVar1 != (Translator *)0x0)) {
    if (prop == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar3 = strlen(prop);
      (*(pTVar1->super_Interface)._vptr_Interface[5])(val,pTVar1,sVar3,prop);
    }
  }
  return;
}

Assistant:

void helicsTranslatorSet(HelicsTranslator trans, const char* prop, double val, HelicsError* err)
{
    auto* translator = getTranslator(trans, err);
    if (translator == nullptr) {
        return;
    }
    CHECK_NULL_STRING(prop, void());
    try {
        translator->set(prop, val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}